

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ypipe.hpp
# Opt level: O0

bool __thiscall zmq::ypipe_t<zmq::msg_t,_256>::flush(ypipe_t<zmq::msg_t,_256> *this)

{
  metadata_t *pmVar1;
  msg_t *in_RDI;
  msg_t *this_00;
  bool local_1;
  
  if (((__base_type *)&in_RDI[1]._u.base.metadata)->_M_p ==
      *(__pointer_type *)((long)&in_RDI[1]._u + 0x10)) {
    local_1 = true;
  }
  else {
    this_00 = in_RDI;
    pmVar1 = (metadata_t *)
             atomic_ptr_t<zmq::msg_t>::cas
                       ((atomic_ptr_t<zmq::msg_t> *)in_RDI,in_RDI,(msg_t *)0x1f3dfb);
    if (pmVar1 == in_RDI[1]._u.base.metadata) {
      in_RDI[1]._u.base.metadata = (metadata_t *)in_RDI[1]._u.cmsg.size;
      local_1 = true;
    }
    else {
      atomic_ptr_t<zmq::msg_t>::set((atomic_ptr_t<zmq::msg_t> *)this_00,in_RDI);
      in_RDI[1]._u.base.metadata = (metadata_t *)in_RDI[1]._u.cmsg.size;
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool flush ()
    {
        //  If there are no un-flushed items, do nothing.
        if (_w == _f)
            return true;

        //  Try to set 'c' to 'f'.
        if (_c.cas (_w, _f) != _w) {
            //  Compare-and-swap was unseccessful because 'c' is NULL.
            //  This means that the reader is asleep. Therefore we don't
            //  care about thread-safeness and update c in non-atomic
            //  manner. We'll return false to let the caller know
            //  that reader is sleeping.
            _c.set (_f);
            _w = _f;
            return false;
        }

        //  Reader is alive. Nothing special to do now. Just move
        //  the 'first un-flushed item' pointer to 'f'.
        _w = _f;
        return true;
    }